

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

TermList ApplicativeHelper::getNthArg(TermList arrowSort,uint argNum)

{
  Term *pTVar1;
  TermList *pTVar2;
  int in_ESI;
  TermList res;
  int local_14;
  TermList local_8;
  
  Kernel::TermList::TermList(&local_8);
  for (local_14 = in_ESI; local_14 != 0; local_14 = local_14 + -1) {
    pTVar1 = Kernel::TermList::term((TermList *)0x8409c8);
    pTVar2 = Kernel::Term::nthArgument(pTVar1,0);
    local_8._content = pTVar2->_content;
    pTVar1 = Kernel::TermList::term((TermList *)0x8409e4);
    Kernel::Term::nthArgument(pTVar1,1);
  }
  return (TermList)local_8._content;
}

Assistant:

TermList ApplicativeHelper::getNthArg(TermList arrowSort, unsigned argNum)
{
  ASS(argNum > 0);

  TermList res;
  while(argNum >=1){
    ASS(arrowSort.isArrowSort());
    res = *arrowSort.term()->nthArgument(0);
    arrowSort = *arrowSort.term()->nthArgument(1);
    argNum--;
  }
  return res;
}